

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetOwnProperty
               (Var instance,PropertyId propertyId,Var *value,ScriptContext *requestContext,
               PropertyValueInfo *propertyValueInfo)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *objectWithProperty;
  
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  if (bVar1) {
    objectWithProperty = VarTo<Js::RecyclableObject>(instance);
    if (objectWithProperty != (RecyclableObject *)0x0) {
      iVar2 = (*(objectWithProperty->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x12])
                        (objectWithProperty,objectWithProperty,(ulong)(uint)propertyId,value,
                         propertyValueInfo,requestContext);
      bVar1 = iVar2 == 1;
      if (propertyValueInfo != (PropertyValueInfo *)0x0 && bVar1) {
        CacheOperators::CachePropertyRead
                  (instance,objectWithProperty,false,propertyId,false,propertyValueInfo,
                   requestContext);
        bVar1 = true;
      }
      goto LAB_00aa7eb2;
    }
  }
  bVar1 = false;
LAB_00aa7eb2:
  return (BOOL)bVar1;
}

Assistant:

BOOL JavascriptOperators::GetOwnProperty(Var instance, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo * propertyValueInfo)
    {
        BOOL result;
        if (TaggedNumber::Is(instance))
        {
            result = false;
        }
        else
        {
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            result = object && object->GetProperty(object, propertyId, value, propertyValueInfo, requestContext);

            if (propertyValueInfo && result)
            {
                // We can only update the cache in case a property was found, because if it wasn't found, we don't know if it is missing or on a prototype
                CacheOperators::CachePropertyRead(instance, object, false /* isRoot */, propertyId, false /* isMissing */, propertyValueInfo, requestContext);
            }
        }
        return result;
    }